

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_> * __thiscall
cmTarget::GetLinkImplementationClosure(cmTarget *this,string *config)

{
  mapped_type *tgts;
  LinkImplementationLibraries *pLVar1;
  pointer item;
  set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_> emitted;
  _Rb_tree<const_cmTarget_*,_const_cmTarget_*,_std::_Identity<const_cmTarget_*>,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
  local_60;
  
  tgts = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::LinkImplClosure,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::LinkImplClosure>_>_>
         ::operator[](&((this->Internal).Pointer)->LinkImplClosureMap,config);
  if (tgts->Done == false) {
    tgts->Done = true;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    pLVar1 = GetLinkImplementationLibrariesInternal(this,config,this);
    item = (pLVar1->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
           _M_impl.super__Vector_impl_data._M_start;
    if (item != (pLVar1->Libraries).
                super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                super__Vector_impl_data._M_finish) {
      do {
        processILibs(config,this,&item->super_cmLinkItem,
                     &tgts->super_vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>,
                     (set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
                      *)&local_60);
        item = item + 1;
      } while (item != (pLVar1->Libraries).
                       super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    }
    std::
    _Rb_tree<const_cmTarget_*,_const_cmTarget_*,_std::_Identity<const_cmTarget_*>,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>
    ::~_Rb_tree(&local_60);
  }
  return &tgts->super_vector<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>;
}

Assistant:

std::vector<cmTarget const*> const&
cmTarget::GetLinkImplementationClosure(const std::string& config) const
{
  cmTargetInternals::LinkImplClosure& tgts =
    this->Internal->LinkImplClosureMap[config];
  if(!tgts.Done)
    {
    tgts.Done = true;
    std::set<cmTarget const*> emitted;

    cmTarget::LinkImplementationLibraries const* impl
      = this->GetLinkImplementationLibraries(config);

    for(std::vector<cmLinkImplItem>::const_iterator
          it = impl->Libraries.begin();
        it != impl->Libraries.end(); ++it)
      {
      processILibs(config, this, *it, tgts , emitted);
      }
    }
  return tgts;
}